

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode
JsCreateTracedExternalObject
          (void *data,size_t inlineSlotSize,JsTraceCallback traceCallback,
          JsFinalizeCallback finalizeCallback,JsValueRef prototype,JsValueRef *object)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  JsErrorCode JVar2;
  BOOL BVar3;
  JsrtContext *currentContext;
  RecyclableObject *pRVar4;
  JsrtExternalObject *pJVar5;
  AutoNestedHandledExceptionType local_88 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_48 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_48 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  currentContext = JsrtContext::GetCurrent();
  JVar2 = CheckContext(currentContext,false,false);
  if (JVar2 != JsNoError) {
    return JVar2;
  }
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_88,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTAllocateExternalObject
              (scriptContext->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_48,
               prototype);
  }
  if (object == (JsValueRef *)0x0) {
    JVar2 = JsErrorNullArgument;
  }
  else {
    if (prototype == (JsValueRef)0x0) {
      pRVar4 = (RecyclableObject *)0x0;
    }
    else {
      BVar3 = Js::JavascriptOperators::IsObjectOrNull(prototype);
      if (BVar3 == 0) {
        JVar2 = JsErrorArgumentNotObject;
        goto LAB_003c37ee;
      }
      pRVar4 = Js::VarTo<Js::RecyclableObject>(prototype);
      pSVar1 = (((((pRVar4->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar2 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003c37ee;
        prototype = Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
      }
      pRVar4 = Js::VarTo<Js::RecyclableObject>(prototype);
    }
    JVar2 = JsErrorInvalidArgument;
    if (inlineSlotSize >> 0x20 == 0) {
      pJVar5 = JsrtExternalObject::Create
                         (data,(uint)inlineSlotSize,traceCallback,finalizeCallback,pRVar4,
                          scriptContext,(JsrtExternalType *)0x0);
      *object = pJVar5;
      JVar2 = JsNoError;
      if (scriptContext->TTDShouldPerformRecordAction == true) {
        if (_actionEntryPopper.m_actionEvent == (EventLogEntry *)0x0) {
          TTDAbort_unrecoverable_error("Why are we calling this then???");
        }
        *(JsrtExternalObject **)_actionEntryPopper.m_actionEvent = pJVar5;
      }
    }
  }
LAB_003c37ee:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_88);
  if (auStack_48 != (undefined1  [8])0x0) {
    if (*(int32 *)((long)auStack_48 + 4) != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    *(JsErrorCode *)((long)auStack_48 + 4) = JVar2;
  }
  return JVar2;
}

Assistant:

CHAKRA_API JsCreateTracedExternalObject(
    _In_opt_ void *data,
    _In_opt_ size_t inlineSlotSize,
    _In_opt_ JsTraceCallback traceCallback,
    _In_opt_ JsFinalizeCallback finalizeCallback,
    _In_opt_ JsValueRef prototype,
    _Out_ JsValueRef *object)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTAllocateExternalObject, prototype);

        PARAM_NOT_NULL(object);

        Js::RecyclableObject * prototypeObject = nullptr;
        if (prototype != JS_INVALID_REFERENCE)
        {
            VALIDATE_INCOMING_OBJECT_OR_NULL(prototype, scriptContext);
            prototypeObject = Js::VarTo<Js::RecyclableObject>(prototype);
        }
        if (inlineSlotSize > UINT32_MAX)
        {
            return JsErrorInvalidArgument;
        }
        *object = JsrtExternalObject::Create(data, (uint)inlineSlotSize, traceCallback, finalizeCallback, prototypeObject, scriptContext, nullptr);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, object);

        return JsNoError;
    });
}